

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5FlushToDisk(Fts5Table *pTab)

{
  int iVar1;
  long *plVar2;
  
  for (plVar2 = *(long **)(*(long *)&pTab[1].base.nRef + 0x48); plVar2 != (long *)0x0;
      plVar2 = (long *)plVar2[1]) {
    if (((int)plVar2[4] == 1) && ((Fts5Table *)*plVar2 == pTab)) {
      *(byte *)(plVar2 + 10) = *(byte *)(plVar2 + 10) | 0x20;
    }
  }
  iVar1 = sqlite3Fts5StorageSync((Fts5Storage *)pTab[1].base.pModule);
  return iVar1;
}

Assistant:

static void fts5TripCursors(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->ePlan==FTS5_PLAN_MATCH
     && pCsr->base.pVtab==(sqlite3_vtab*)pTab 
    ){
      CsrFlagSet(pCsr, FTS5CSR_REQUIRE_RESEEK);
    }
  }
}